

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_util.c
# Opt level: O1

void buffer_appendf(char **_buf,int *bufpos,void *fmt,...)

{
  int iVar1;
  char in_AL;
  int iVar2;
  char *__s;
  char *pcVar3;
  undefined8 in_RCX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list ap;
  undefined8 local_108;
  undefined1 *local_100;
  undefined1 *local_f8;
  undefined1 local_e8 [24];
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  pcVar3 = *_buf;
  local_d0 = in_RCX;
  local_c8 = in_R8;
  local_c0 = in_R9;
  __s = (char *)malloc(0x80);
  local_108 = 0x3000000018;
  local_100 = &stack0x00000008;
  local_f8 = local_e8;
  iVar2 = vsnprintf(__s,0x80,(char *)fmt,&local_108);
  if (0x7f < iVar2) {
    __s = (char *)realloc(__s,(ulong)(iVar2 + 1));
    local_108 = 0x3000000018;
    local_100 = &stack0x00000008;
    local_f8 = local_e8;
    vsprintf(__s,(char *)fmt,&local_108);
  }
  pcVar3 = (char *)realloc(pcVar3,(long)(*bufpos + iVar2 + 1));
  *_buf = pcVar3;
  iVar1 = *bufpos;
  memcpy(pcVar3 + iVar1,__s,(long)(iVar2 + 1));
  *bufpos = iVar2 + iVar1;
  free(__s);
  return;
}

Assistant:

static void buffer_appendf(char **_buf, int *bufpos, void *fmt, ...)
{
    char *buf = *_buf;
    va_list ap;

    int salloc = 128;
    char *s = malloc(salloc);

    va_start(ap, fmt);
    int slen = vsnprintf(s, salloc, fmt, ap);
    va_end(ap);

    if (slen >= salloc) {
        s = realloc(s, slen + 1);
        va_start(ap, fmt);
        vsprintf((char*) s, fmt, ap);
        va_end(ap);
    }

    buf = realloc(buf, *bufpos + slen + 1);
    *_buf = buf;

    memcpy(&buf[*bufpos], s, slen + 1); // get trailing \0
    (*bufpos) += slen;

    free(s);
}